

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChAparticle::ComputeJacobianForContactPart
          (ChAparticle *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ChMatrix33<double> *alignment;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChMatrix33<double> Jr1;
  ChMatrix33<double> Jx1;
  ChVector<double> m_p1_loc;
  ChMatrix33<double> local_148;
  ChMatrix33<double> local_f8;
  ulong local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ChMatrix33<double> *local_90;
  undefined8 local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 local_50;
  ChMatrix33<double> *local_48;
  ChMatrix33<double> *local_40;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *local_38;
  
  alignment = &(this->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               Amatrix;
  ChTransform<double>::TransformParentToLocal
            (abs_point,
             &(this->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
              pos,alignment);
  local_90 = contact_plane;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_f8,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_90);
  if (!second) {
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6].
         _4_4_ ^ 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_ =
         local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
         _4_4_ ^ 0x80000000;
    auVar6._0_8_ = -local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8];
    auVar6._8_4_ = 0;
    auVar6._12_4_ = 0x80000000;
    local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlps_avx(auVar6);
  }
  local_90 = (ChMatrix33<double> *)0x0;
  auVar8._0_8_ = local_98 ^ 0x8000000000000000;
  auVar8._8_4_ = 0;
  auVar8._12_4_ = 0x80000000;
  local_88 = vmovlps_avx(auVar8);
  local_78 = local_98;
  auVar2._8_8_ = uStack_a0;
  auVar2._0_8_ = local_a8;
  local_70 = 0;
  local_80 = uStack_a0;
  local_68._0_8_ = local_a8 ^ 0x8000000000000000;
  local_68._8_4_ = (int)uStack_a0;
  local_68._12_4_ = (uint)((ulong)uStack_a0 >> 0x20) ^ 0x80000000;
  local_58 = vmovlps_avx(auVar2);
  local_50 = 0;
  local_48 = contact_plane;
  local_40 = alignment;
  local_38 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_90;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_148,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_48);
  if (second) {
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6].
         _4_4_ ^ 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_ =
         local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
         _4_4_ ^ 0x80000000;
    auVar7._0_8_ = -local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8];
    auVar7._8_4_ = 0;
    auVar7._12_4_ = 0x80000000;
    local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlps_avx(auVar7);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_N->Cq >> 3) & 0x1fffffff) & 6;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  if (uVar3 != 0) {
    memcpy(&jacobian_tuple_N->Cq,&local_f8,(ulong)(uVar4 * 8));
  }
  if (uVar4 != 3) {
    uVar5 = (ulong)(uVar4 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5),
           (void *)((long)local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5),0x18 - uVar5);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_U->Cq >> 3) & 0x1fffffff) & 6;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  if (uVar3 != 0) {
    memcpy(&jacobian_tuple_U->Cq,
           (double *)
           ((long)local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x18),(ulong)(uVar4 * 8));
  }
  if (uVar4 != 3) {
    uVar5 = (ulong)(uVar4 << 3);
    memcpy((void *)((long)(jacobian_tuple_U->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5),
           (void *)((long)local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5 + 0x18),0x18 - uVar5);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_V->Cq >> 3) & 0x1fffffff) & 6;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  if (uVar3 != 0) {
    memcpy(&jacobian_tuple_V->Cq,
           (double *)
           ((long)local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x30),(ulong)(uVar4 * 8));
  }
  if (uVar4 != 3) {
    uVar5 = (ulong)(uVar4 << 3);
    memcpy((void *)((long)(jacobian_tuple_V->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5),
           (void *)((long)local_f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5 + 0x30),0x18 - uVar5);
  }
  pdVar1 = (jacobian_tuple_N->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  uVar5 = (ulong)(uVar4 << 3);
  memcpy(pdVar1,&local_148,uVar5);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_N->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5 + 0x18),
           (void *)((long)local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5),0x18 - uVar5);
  }
  pdVar1 = (jacobian_tuple_U->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  uVar5 = (ulong)(uVar4 << 3);
  memcpy(pdVar1,(double *)
                ((long)local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x18),uVar5);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_U->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5 + 0x18),
           (void *)((long)local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5 + 0x18),0x18 - uVar5);
  }
  pdVar1 = (jacobian_tuple_V->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
           m_storage.m_data.array + 3;
  uVar3 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
  uVar4 = 3;
  if (uVar3 < 3) {
    uVar4 = uVar3;
  }
  uVar5 = (ulong)(uVar4 << 3);
  memcpy(pdVar1,(double *)
                ((long)local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x30),uVar5);
  if (uVar3 < 3) {
    memcpy((void *)((long)(jacobian_tuple_V->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar5 + 0x18),
           (void *)((long)local_148.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar5 + 0x30),0x18 - uVar5);
  }
  return;
}

Assistant:

void ChAparticle::ComputeJacobianForContactPart(
    const ChVector<>& abs_point,
    ChMatrix33<>& contact_plane,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_N,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_U,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_V,
    bool second) {
    ChVector<> m_p1_loc = this->TransformPointParentToLocal(abs_point);

    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;
    
    ChStarMatrix33<> Ps1(m_p1_loc);
    ChMatrix33<> Jr1 = contact_plane.transpose() * GetA() * Ps1;
    if (second)
        Jr1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);

    jacobian_tuple_N.Get_Cq().segment(3, 3) = Jr1.row(0);
    jacobian_tuple_U.Get_Cq().segment(3, 3) = Jr1.row(1);
    jacobian_tuple_V.Get_Cq().segment(3, 3) = Jr1.row(2);
}